

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.h
# Opt level: O0

void __thiscall
hedg::Rest_Client::
send<boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>,hedg::params::place_order<hedg::Lay>>
          (Rest_Client *this,
          _func_void_message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_ptr_place_order<hedg::Lay>
          *f,place_order<hedg::Lay> *p)

{
  place_order<hedg::Lay> pVar1;
  place_order<hedg::Lay> *ppVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 in_stack_fffffffffffffed8 [72];
  string_view local_b0;
  undefined1 local_a0 [8];
  request<http::string_body> req;
  place_order<hedg::Lay> *p_local;
  _func_void_message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_ptr_place_order<hedg::Lay>
  *f_local;
  Rest_Client *this_local;
  
  ppVar2 = p;
  req.
  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
  .value_.field_2._8_8_ = p;
  boost::basic_string_view<char,std::char_traits<char>>::basic_string_view<std::allocator<char>>
            ((basic_string_view<char,std::char_traits<char>> *)&local_b0,&p->end_point);
  boost::beast::http::
  message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
  ::message<int,void>((message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
                       *)local_a0,post,local_b0,0xb);
  params::place_order<hedg::Lay>::place_order
            ((place_order<hedg::Lay> *)&stack0xfffffffffffffee8,ppVar2);
  pVar1.end_point._M_string_length = (size_type)this;
  pVar1.end_point._0_8_ = p;
  pVar1.end_point.field_2._M_allocated_capacity = (size_type)ppVar2;
  pVar1.end_point.field_2._8_8_ = f;
  auVar3 = in_stack_fffffffffffffed8._0_32_;
  auVar4 = in_stack_fffffffffffffed8._32_32_;
  pVar1.session_id._M_dataplus = (_Alloc_hider)auVar3[0];
  pVar1.session_id._1_7_ = auVar3._1_7_;
  pVar1.session_id._M_string_length = auVar3._8_8_;
  pVar1.session_id.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        )auVar3._16_16_;
  pVar1.market_id._M_dataplus = (_Alloc_hider)auVar4[0];
  pVar1.market_id._1_7_ = auVar4._1_7_;
  pVar1.market_id._M_string_length = auVar4._8_8_;
  pVar1.market_id.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        )auVar4._16_16_;
  pVar1.orders = (vector<hedg::Order,_std::allocator<hedg::Order>_> *)
                 in_stack_fffffffffffffed8._64_8_;
  (*f)((message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
        *)local_a0,pVar1);
  params::place_order<hedg::Lay>::~place_order((place_order<hedg::Lay> *)&stack0xfffffffffffffee8);
  boost::beast::http::
  write<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>
            (&(this->super_Client<hedg::Rest_Client>).sock_,
             (message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
              *)local_a0);
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::~message((message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
              *)local_a0);
  return;
}

Assistant:

void send(void(*f)(Buff&, T), T p) {
		http::request<http::string_body> req{ http::verb::post, p.end_point, 11 };
		f(req, p);
		http::write(sock_, req);
	}